

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_35(QPDF *pdf,char *arg2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 uVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  mapped_type *this_00;
  reference ppVar6;
  char *pcVar7;
  ulong uVar8;
  unsigned_long *puVar9;
  ostream *poVar10;
  byte local_44a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  int local_3c4;
  size_t local_3c0;
  unsigned_long local_3b8;
  ulong local_3b0;
  size_t i_2;
  string t;
  size_t i_1;
  string local_378 [6];
  bool is_binary;
  string data;
  string *filename_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>
  *iter;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
  *__range1;
  allocator<char> local_319;
  string local_318 [39];
  allocator<char> local_2f1;
  string local_2f0 [32];
  QPDFObjectHandle local_2d0;
  undefined1 local_2c0 [8];
  QPDFObjectHandle stream;
  string local_2a8 [32];
  QPDFObjectHandle local_288;
  undefined1 local_278 [8];
  string filename;
  string local_250 [36];
  byte local_22c;
  byte local_22b;
  byte local_22a;
  allocator<char> local_229;
  string local_228 [32];
  QPDFObjectHandle local_208;
  QPDFObjectHandle local_1f8;
  byte local_1e4;
  byte local_1e3;
  byte local_1e2;
  allocator<char> local_1e1;
  string local_1e0 [32];
  QPDFObjectHandle local_1c0;
  byte local_1ad;
  byte local_1ac;
  byte local_1ab;
  byte local_1aa;
  allocator<char> local_1a9;
  string local_1a8 [32];
  QPDFObjectHandle local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  byte local_154;
  byte local_153;
  byte local_152;
  allocator<char> local_151;
  string local_150 [32];
  QPDFObjectHandle local_130;
  undefined1 local_120 [8];
  QPDFObjectHandle item;
  int i;
  QPDFObjectHandle local_e8;
  allocator<char> local_d1;
  string local_d0 [32];
  undefined1 local_b0 [8];
  QPDFObjectHandle embeddedFiles;
  string local_98 [32];
  undefined1 local_78 [8];
  QPDFObjectHandle names;
  undefined1 local_58 [8];
  QPDFObjectHandle root;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
  attachments;
  char *arg2_local;
  QPDF *pdf_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
         *)&root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount);
  QPDF::getRoot();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"/Names",
             (allocator<char> *)
             ((long)&embeddedFiles.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&embeddedFiles.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"/EmbeddedFiles",&local_d1);
  QPDFObjectHandle::getKey((string *)local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i,"/Names",
             (allocator<char> *)
             ((long)&item.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::getKey((string *)&local_e8);
  QPDFObjectHandle::operator=((QPDFObjectHandle *)local_78,&local_e8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_e8);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&item.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  for (item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._0_4_ = 0;
      iVar5 = (int)item.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
      iVar4 = QPDFObjectHandle::getArrayNItems(), iVar5 < iVar4;
      item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_4_ =
           (int)item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi + 1) {
    QPDFObjectHandle::getArrayItem((int)local_120);
    local_152 = 0;
    local_153 = 0;
    local_154 = 0;
    local_1aa = 0;
    local_1ab = 0;
    local_1ac = 0;
    local_1ad = 0;
    local_1e2 = 0;
    local_1e3 = 0;
    local_1e4 = 0;
    local_22a = 0;
    local_22b = 0;
    local_22c = 0;
    filename.field_2._M_local_buf[0xe] = '\0';
    filename.field_2._M_local_buf[0xd] = '\0';
    filename.field_2._M_local_buf[0xc] = '\0';
    bVar2 = QPDFObjectHandle::isDictionary();
    local_44a = 0;
    if ((bVar2 & 1) != 0) {
      std::allocator<char>::allocator();
      local_152 = 1;
      std::__cxx11::string::string<std::allocator<char>>(local_150,"/Type",&local_151);
      local_153 = 1;
      QPDFObjectHandle::getKey((string *)&local_130);
      local_154 = 1;
      bVar2 = QPDFObjectHandle::isName();
      local_44a = 0;
      if ((bVar2 & 1) != 0) {
        std::allocator<char>::allocator();
        local_1aa = 1;
        std::__cxx11::string::string<std::allocator<char>>(local_1a8,"/Type",&local_1a9);
        local_1ab = 1;
        QPDFObjectHandle::getKey((string *)&local_188);
        local_1ac = 1;
        QPDFObjectHandle::getName_abi_cxx11_();
        local_1ad = 1;
        bVar3 = std::operator==(&local_178,"/Filespec");
        local_44a = 0;
        if (bVar3) {
          std::allocator<char>::allocator();
          local_1e2 = 1;
          std::__cxx11::string::string<std::allocator<char>>(local_1e0,"/EF",&local_1e1);
          local_1e3 = 1;
          QPDFObjectHandle::getKey((string *)&local_1c0);
          local_1e4 = 1;
          bVar2 = QPDFObjectHandle::isDictionary();
          local_44a = 0;
          if ((bVar2 & 1) != 0) {
            std::allocator<char>::allocator();
            local_22a = 1;
            std::__cxx11::string::string<std::allocator<char>>(local_228,"/EF",&local_229);
            local_22b = 1;
            QPDFObjectHandle::getKey((string *)&local_208);
            local_22c = 1;
            std::allocator<char>::allocator();
            filename.field_2._M_local_buf[0xe] = '\x01';
            std::__cxx11::string::string<std::allocator<char>>
                      (local_250,"/F",(allocator<char> *)(filename.field_2._M_local_buf + 0xf));
            filename.field_2._M_local_buf[0xd] = '\x01';
            QPDFObjectHandle::getKey((string *)&local_1f8);
            filename.field_2._M_local_buf[0xc] = '\x01';
            local_44a = QPDFObjectHandle::isStream();
          }
        }
      }
    }
    if ((filename.field_2._M_local_buf[0xc] & 1U) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(&local_1f8);
    }
    if ((filename.field_2._M_local_buf[0xd] & 1U) != 0) {
      std::__cxx11::string::~string(local_250);
    }
    if ((filename.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(filename.field_2._M_local_buf + 0xf));
    }
    if ((local_22c & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(&local_208);
    }
    if ((local_22b & 1) != 0) {
      std::__cxx11::string::~string(local_228);
    }
    if ((local_22a & 1) != 0) {
      std::allocator<char>::~allocator(&local_229);
    }
    if ((local_1e4 & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(&local_1c0);
    }
    if ((local_1e3 & 1) != 0) {
      std::__cxx11::string::~string(local_1e0);
    }
    if ((local_1e2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_1e1);
    }
    if ((local_1ad & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_178);
    }
    if ((local_1ac & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(&local_188);
    }
    if ((local_1ab & 1) != 0) {
      std::__cxx11::string::~string(local_1a8);
    }
    if ((local_1aa & 1) != 0) {
      std::allocator<char>::~allocator(&local_1a9);
    }
    if ((local_154 & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(&local_130);
    }
    if ((local_153 & 1) != 0) {
      std::__cxx11::string::~string(local_150);
    }
    if ((local_152 & 1) != 0) {
      std::allocator<char>::~allocator(&local_151);
    }
    if ((local_44a & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_2a8,"/F",
                 (allocator<char> *)
                 ((long)&stream.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::getKey((string *)&local_288);
      QPDFObjectHandle::getStringValue_abi_cxx11_();
      QPDFObjectHandle::~QPDFObjectHandle(&local_288);
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&stream.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2f0,"/EF",&local_2f1);
      QPDFObjectHandle::getKey((string *)&local_2d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_318,"/F",&local_319);
      QPDFObjectHandle::getKey((string *)local_2c0);
      std::__cxx11::string::~string(local_318);
      std::allocator<char>::~allocator(&local_319);
      QPDFObjectHandle::~QPDFObjectHandle(&local_2d0);
      std::__cxx11::string::~string(local_2f0);
      std::allocator<char>::~allocator(&local_2f1);
      QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&__range1);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
                              *)&root.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount,(key_type *)local_278);
      std::shared_ptr<Buffer>::operator=(this_00,(shared_ptr<Buffer> *)&__range1);
      std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)&__range1);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_2c0);
      std::__cxx11::string::~string((string *)local_278);
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_120);
  }
  this = &root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
                    *)this);
  iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
            ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
                   *)this);
  do {
    bVar3 = std::operator!=(&__end1,(_Self *)&iter);
    if (!bVar3) {
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_b0);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_78);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_58);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
              *)&root.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>
             ::operator*(&__end1);
    data.field_2._8_8_ = ppVar6;
    std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &ppVar6->second);
    pcVar7 = (char *)Buffer::getBuffer();
    std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &ppVar6->second);
    uVar8 = Buffer::getSize();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_378,pcVar7,uVar8,(allocator *)((long)&i_1 + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
    i_1._6_1_ = 0;
    for (t.field_2._8_8_ = 0; uVar1 = t.field_2._8_8_, uVar8 = std::__cxx11::string::size(),
        (ulong)uVar1 < uVar8; t.field_2._8_8_ = t.field_2._8_8_ + 1) {
      pcVar7 = (char *)std::__cxx11::string::at((ulong)local_378);
      if ((*pcVar7 < '\0') ||
         (pcVar7 = (char *)std::__cxx11::string::at((ulong)local_378), '~' < *pcVar7)) {
        i_1._6_1_ = 1;
        break;
      }
    }
    if ((i_1._6_1_ & 1) != 0) {
      std::__cxx11::string::string((string *)&i_2);
      local_3b0 = 0;
      while( true ) {
        uVar8 = local_3b0;
        local_3b8 = std::__cxx11::string::size();
        local_3c4 = 0x14;
        local_3c0 = QIntC::to_size<int>(&local_3c4);
        puVar9 = std::min<unsigned_long>(&local_3b8,&local_3c0);
        if (*puVar9 <= uVar8) break;
        pcVar7 = (char *)std::__cxx11::string::at((ulong)local_378);
        if ((*pcVar7 < ' ') ||
           (pcVar7 = (char *)std::__cxx11::string::at((ulong)local_378), '~' < *pcVar7)) {
          std::__cxx11::string::operator+=((string *)&i_2,".");
        }
        else {
          pcVar7 = (char *)std::__cxx11::string::at((ulong)local_378);
          std::__cxx11::string::operator+=((string *)&i_2,*pcVar7);
        }
        local_3b0 = local_3b0 + 1;
      }
      iVar5 = std::__cxx11::string::size();
      QUtil::uint_to_string_abi_cxx11_((ulonglong)&local_428,iVar5);
      std::operator+(&local_408," (",&local_428);
      std::operator+(&local_3e8,&local_408," bytes)");
      std::__cxx11::string::operator+=((string *)&i_2,(string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_408);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::operator=(local_378,(string *)&i_2);
      std::__cxx11::string::~string((string *)&i_2);
    }
    poVar10 = std::operator<<((ostream *)&std::cout,(string *)data.field_2._8_8_);
    poVar10 = std::operator<<(poVar10,":\n");
    poVar10 = std::operator<<(poVar10,local_378);
    std::operator<<(poVar10,"--END--\n");
    std::__cxx11::string::~string(local_378);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

static void
test_35(QPDF& pdf, char const* arg2)
{
    // Extract attachments

    std::map<std::string, std::shared_ptr<Buffer>> attachments;
    QPDFObjectHandle root = pdf.getRoot();
    QPDFObjectHandle names = root.getKey("/Names");
    QPDFObjectHandle embeddedFiles = names.getKey("/EmbeddedFiles");
    names = embeddedFiles.getKey("/Names");
    for (int i = 0; i < names.getArrayNItems(); ++i) {
        QPDFObjectHandle item = names.getArrayItem(i);
        if (item.isDictionary() && item.getKey("/Type").isName() &&
            (item.getKey("/Type").getName() == "/Filespec") && item.getKey("/EF").isDictionary() &&
            item.getKey("/EF").getKey("/F").isStream()) {
            std::string filename = item.getKey("/F").getStringValue();
            QPDFObjectHandle stream = item.getKey("/EF").getKey("/F");
            attachments[filename] = stream.getStreamData();
        }
    }
    for (auto const& iter: attachments) {
        std::string const& filename = iter.first;
        std::string data = std::string(
            reinterpret_cast<char const*>(iter.second->getBuffer()), iter.second->getSize());
        bool is_binary = false;
        for (size_t i = 0; i < data.size(); ++i) {
            if ((data.at(i) < 0) || (data.at(i) > 126)) {
                is_binary = true;
                break;
            }
        }
        if (is_binary) {
            std::string t;
            for (size_t i = 0; i < std::min(data.size(), QIntC::to_size(20)); ++i) {
                if ((data.at(i) >= 32) && (data.at(i) <= 126)) {
                    t += data.at(i);
                } else {
                    t += ".";
                }
            }
            t += " (" + QUtil::uint_to_string(data.size()) + " bytes)";
            data = t;
        }
        std::cout << filename << ":\n" << data << "--END--\n";
    }
}